

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O1

bool __thiscall ON_BrepTrim::CopyFrom(ON_BrepTrim *this,ON_Object *src)

{
  bool bVar1;
  ON_BrepTrim *src_00;
  
  if (src == (ON_Object *)0x0) {
    src_00 = (ON_BrepTrim *)0x0;
  }
  else {
    bVar1 = ON_Object::IsKindOf(src,&m_ON_BrepTrim_class_rtti);
    src_00 = (ON_BrepTrim *)0x0;
    if (bVar1) {
      src_00 = (ON_BrepTrim *)src;
    }
  }
  if (src_00 != (ON_BrepTrim *)0x0) {
    operator=(this,src_00);
  }
  return src_00 != (ON_BrepTrim *)0x0;
}

Assistant:

ON_BrepTrim::ON_BrepTrim()
{
  memset(&m_trim_user,0,sizeof(m_trim_user));
  m_vi[0] = m_vi[1] = -1; 
  m_tolerance[0] = m_tolerance[1] = ON_UNSET_VALUE;
  m_pline.Reserve(4); // This is a stopgap fix to insures the memory 
                      // pool used for pline segments is the same as
                      // the memory pool used for the rest of this brep.
  //m_P[0] = ON_3dPoint::UnsetPoint;
  //m_P[1] = ON_3dPoint::UnsetPoint;
}